

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puts.c
# Opt level: O2

int puts(char *__s)

{
  char **ppcVar1;
  char cVar2;
  unsigned_long uVar3;
  int iVar4;
  
  mtx_lock(&stdout->mtx);
  iVar4 = _PDCLIB_prepwrite(stdout);
  do {
    if (iVar4 == -1) {
      iVar4 = -1;
LAB_00103852:
      mtx_unlock(&stdout->mtx);
      return iVar4;
    }
    do {
      cVar2 = *__s;
      if (cVar2 == '\0') {
        ppcVar1 = &stdout->buffer;
        uVar3 = stdout->bufidx;
        stdout->bufidx = uVar3 + 1;
        (*ppcVar1)[uVar3] = '\n';
        if ((stdout->bufidx == stdout->bufsize) || ((stdout->status & 6) != 0)) {
          iVar4 = _PDCLIB_flushbuffer(stdout);
        }
        else {
          iVar4 = 0;
        }
        goto LAB_00103852;
      }
      __s = __s + 1;
      ppcVar1 = &stdout->buffer;
      uVar3 = stdout->bufidx;
      stdout->bufidx = uVar3 + 1;
      (*ppcVar1)[uVar3] = cVar2;
    } while (stdout->bufidx != stdout->bufsize);
    iVar4 = _PDCLIB_flushbuffer(stdout);
  } while( true );
}

Assistant:

int puts( const char * s )
{
    _PDCLIB_LOCK( stdout->mtx );

    if ( _PDCLIB_prepwrite( stdout ) == EOF )
    {
        _PDCLIB_UNLOCK( stdout->mtx );
        return EOF;
    }

    while ( *s != '\0' )
    {
        stdout->buffer[ stdout->bufidx++ ] = *s++;

        if ( stdout->bufidx == stdout->bufsize )
        {
            if ( _PDCLIB_flushbuffer( stdout ) == EOF )
            {
                _PDCLIB_UNLOCK( stdout->mtx );
                return EOF;
            }
        }
    }

    stdout->buffer[ stdout->bufidx++ ] = '\n';

    if ( ( stdout->bufidx == stdout->bufsize ) ||
         ( stdout->status & ( _IOLBF | _IONBF ) ) )
    {
        int rc = _PDCLIB_flushbuffer( stdout );
        _PDCLIB_UNLOCK( stdout->mtx );
        return rc;
    }
    else
    {
        _PDCLIB_UNLOCK( stdout->mtx );
        return 0;
    }
}